

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

float anon_unknown.dwarf_45a12::mapPointToOutside
                (PolylineSegmentedPathwaySegmentRadii *pathway,Vec3 *point)

{
  PointToOutsideMapping mapping;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  PolylineSegmentedPathwaySegmentRadii *pathAlike;
  float local_14 [5];
  
  pathAlike = (PolylineSegmentedPathwaySegmentRadii *)local_14;
  PointToOutsideMapping::PointToOutsideMapping((PointToOutsideMapping *)pathAlike);
  OpenSteer::
  mapPointToPathAlike<OpenSteer::PolylineSegmentedPathwaySegmentRadii,(anonymous_namespace)::PointToOutsideMapping>
            (pathAlike,(Vec3 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (PointToOutsideMapping *)0x13fd91);
  PointToOutsideMapping::~PointToOutsideMapping((PointToOutsideMapping *)0x13fda9);
  return local_14[0];
}

Assistant:

float mapPointToOutside( OpenSteer::PolylineSegmentedPathwaySegmentRadii const& pathway, OpenSteer::Vec3 const& point ) {
        PointToOutsideMapping mapping;
        OpenSteer::mapPointToPathAlike( pathway, point, mapping);
        return mapping.distancePointToPathBoundary;    
    }